

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Waitsome(int incount,MPIABI_Request *array_of_requests,int *outcount,
                   int *array_of_indices,MPIABI_Status *array_of_statuses)

{
  anon_union_24_2_44bf1552_for_mpi_status *paVar1;
  WPI_Status local_c0;
  int local_98;
  int local_94;
  int i_1;
  int ierr;
  MPI_Status local_68;
  int local_4c;
  MPIABI_Status *pMStack_48;
  int i;
  MPI_Status *stats;
  MPI_Request *reqs;
  MPIABI_Status *pMStack_30;
  bool ignore_statuses;
  MPIABI_Status *array_of_statuses_local;
  int *array_of_indices_local;
  int *outcount_local;
  MPIABI_Request *array_of_requests_local;
  int incount_local;
  
  reqs._7_1_ = array_of_statuses == (MPIABI_Status *)0x0;
  pMStack_48 = array_of_statuses;
  stats = (MPI_Status *)array_of_requests;
  pMStack_30 = array_of_statuses;
  array_of_statuses_local = (MPIABI_Status *)array_of_indices;
  array_of_indices_local = outcount;
  outcount_local = (int *)array_of_requests;
  array_of_requests_local._4_4_ = incount;
  if (!(bool)reqs._7_1_) {
    for (local_4c = 0; local_4c < array_of_requests_local._4_4_; local_4c = local_4c + 1) {
      WPI_Status::WPI_Status((WPI_Status *)&i_1,pMStack_30 + local_4c);
      WPI_Status::operator_cast_to_ompi_status_public_t(&local_68,(WPI_Status *)&i_1);
      paVar1 = &pMStack_48->mpi_status + local_4c;
      *(undefined8 *)paVar1 = local_68._0_8_;
      *(undefined8 *)((long)paVar1 + 8) = local_68._8_8_;
      *(size_t *)((long)paVar1 + 0x10) = local_68._ucount;
    }
  }
  local_94 = MPI_Waitsome(array_of_requests_local._4_4_,stats,array_of_indices_local,
                          array_of_statuses_local,pMStack_48);
  local_98 = array_of_requests_local._4_4_;
  if ((reqs._7_1_ & 1) == 0) {
    while (local_98 = local_98 + -1, -1 < local_98) {
      WPI_Status::WPI_Status(&local_c0,(MPI_Status *)(&pMStack_48->mpi_status + local_98));
      memcpy(pMStack_30 + local_98,&local_c0,0x28);
    }
  }
  return local_94;
}

Assistant:

int MPIABI_Waitsome(int incount, MPIABI_Request array_of_requests[],
                               int *outcount, int array_of_indices[],
                               MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < incount; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < incount; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr =
      MPI_Waitsome(incount, reqs, outcount, array_of_indices, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = incount - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = incount - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}